

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O0

void __thiscall Serializer_Operator1_Test::TestBody(Serializer_Operator1_Test *this)

{
  bool bVar1;
  Serializer *pSVar2;
  char *pcVar3;
  AssertHelper local_160;
  Message local_158;
  ByteData local_150;
  string local_138;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  string local_100;
  ByteData local_e0;
  allocator local_c1;
  string local_c0;
  ByteData local_a0;
  allocator local_81;
  string local_80;
  ByteData local_60;
  undefined1 local_38 [8];
  Serializer builder;
  Serializer_Operator1_Test *this_local;
  
  builder._32_8_ = this;
  cfd::core::Serializer::Serializer((Serializer *)local_38);
  pSVar2 = cfd::core::Serializer::operator<<((Serializer *)local_38,1);
  pSVar2 = cfd::core::Serializer::operator<<(pSVar2,2);
  cfd::core::Serializer::operator<<(pSVar2,'\x03');
  cfd::core::Serializer::AddVariableInt((Serializer *)local_38,0x1ffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"f1f2",&local_81);
  cfd::core::ByteData::ByteData(&local_60,&local_80);
  cfd::core::Serializer::AddVariableBuffer((Serializer *)local_38,&local_60);
  cfd::core::ByteData::~ByteData(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"d1d2d3d4",&local_c1);
  cfd::core::ByteData::ByteData(&local_a0,&local_c0);
  cfd::core::Serializer::AddPrefixBuffer((Serializer *)local_38,0xe1e2e3e4,&local_a0);
  cfd::core::ByteData::~ByteData(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"c1c2c3c4",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::ByteData::ByteData(&local_e0,&local_100);
  cfd::core::Serializer::operator<<((Serializer *)local_38,&local_e0);
  cfd::core::ByteData::~ByteData(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::Serializer::Output(&local_150,(Serializer *)local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_138,&local_150);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_118,
             "\"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex().c_str()",
             "01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",pcVar3);
  std::__cxx11::string::~string((string *)&local_138);
  cfd::core::ByteData::~ByteData(&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x2a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::Serializer::~Serializer((Serializer *)local_38);
  return;
}

Assistant:

TEST(Serializer, Operator1) {
  Serializer builder;
  builder << uint32_t{1} << uint64_t{2} << uint8_t{3};
  builder.AddVariableInt(0x01ffff);
  builder.AddVariableBuffer(ByteData("f1f2"));
  builder.AddPrefixBuffer(0xe1e2e3e4, ByteData("d1d2d3d4"));
  builder << ByteData("c1c2c3c4");

  EXPECT_STREQ("01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex().c_str());
}